

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

int event_config_set_max_dispatch_interval
              (event_config *cfg,timeval *max_interval,int max_callbacks,int min_priority)

{
  __suseconds_t _Var1;
  int iVar2;
  
  if (max_interval == (timeval *)0x0) {
    (cfg->max_dispatch_interval).tv_sec = -1;
  }
  else {
    _Var1 = max_interval->tv_usec;
    (cfg->max_dispatch_interval).tv_sec = max_interval->tv_sec;
    (cfg->max_dispatch_interval).tv_usec = _Var1;
  }
  iVar2 = 0x7fffffff;
  if (-1 < max_callbacks) {
    iVar2 = max_callbacks;
  }
  cfg->max_dispatch_callbacks = iVar2;
  if (min_priority < 1) {
    min_priority = 0;
  }
  cfg->limit_callbacks_after_prio = min_priority;
  return 0;
}

Assistant:

int
event_config_set_max_dispatch_interval(struct event_config *cfg,
    const struct timeval *max_interval, int max_callbacks, int min_priority)
{
	if (max_interval)
		memcpy(&cfg->max_dispatch_interval, max_interval,
		    sizeof(struct timeval));
	else
		cfg->max_dispatch_interval.tv_sec = -1;
	cfg->max_dispatch_callbacks =
	    max_callbacks >= 0 ? max_callbacks : INT_MAX;
	if (min_priority < 0)
		min_priority = 0;
	cfg->limit_callbacks_after_prio = min_priority;
	return (0);
}